

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

void provide_xrm_string(char *string,char *progname)

{
  size_t sVar1;
  char *pcVar2;
  char *__src;
  undefined8 *e;
  void *pvVar3;
  ushort **ppuVar4;
  size_t factor1;
  byte bVar5;
  byte *s;
  
  pcVar2 = strchr(string,0x3a);
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"%s: expected a colon in resource string \"%s\"\n",progname,string);
    return;
  }
  s = (byte *)(pcVar2 + 1);
  sVar1 = 1;
  do {
    factor1 = sVar1;
    __src = pcVar2;
    if (__src <= string) break;
    pcVar2 = __src + -1;
    sVar1 = factor1 + 1;
  } while ((byte)(__src[-1] | 4U) != 0x2e);
  e = (undefined8 *)safemalloc(1,0x10,0);
  pvVar3 = safemalloc(factor1,1,0);
  memcpy(pvVar3,__src,factor1);
  *(undefined1 *)((long)pvVar3 + (factor1 - 1)) = 0;
  *e = pvVar3;
  bVar5 = *s;
  if (bVar5 != 0) {
    ppuVar4 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar4 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) break;
      bVar5 = s[1];
      s = s + 1;
    } while (bVar5 != 0);
  }
  pcVar2 = dupstr((char *)s);
  e[1] = pcVar2;
  if (xrmtree == (tree234 *)0x0) {
    xrmtree = newtree234(keycmp);
  }
  pvVar3 = add234(xrmtree,e);
  if (pvVar3 != (void *)0x0) {
    del234(xrmtree,pvVar3);
    add234(xrmtree,e);
    return;
  }
  return;
}

Assistant:

void provide_xrm_string(const char *string, const char *progname)
{
    const char *p, *q;
    char *key;
    struct skeyval *xrms, *ret;

    p = q = strchr(string, ':');
    if (!q) {
        fprintf(stderr, "%s: expected a colon in resource string"
                " \"%s\"\n", progname, string);
        return;
    }
    q++;
    while (p > string && p[-1] != '.' && p[-1] != '*')
        p--;
    xrms = snew(struct skeyval);
    key = snewn(q-p, char);
    memcpy(key, p, q-p);
    key[q-p-1] = '\0';
    xrms->key = key;
    while (*q && isspace((unsigned char)*q))
        q++;
    xrms->value = dupstr(q);

    if (!xrmtree)
        xrmtree = newtree234(keycmp);

    ret = add234(xrmtree, xrms);
    if (ret) {
        /* Override an existing string. */
        del234(xrmtree, ret);
        add234(xrmtree, xrms);
    }
}